

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

Instr * __thiscall
Lowerer::LowerNewScObject
          (Lowerer *this,Instr *newObjInstr,bool callCtor,bool hasArgs,
          bool isBaseClassConstructorNewScObject)

{
  OpCode OVar1;
  Func *func;
  Func *insertBeforeInstr;
  StackSym *pSVar2;
  code *pcVar3;
  byte bVar4;
  bool bVar5;
  JitProfilingInstr *pJVar6;
  Lowerer *pLVar7;
  undefined4 *puVar8;
  Lowerer *newObjDst;
  LabelInstr *pLVar9;
  Lowerer *pLVar10;
  FixedFieldInfo *this_00;
  intptr_t iVar11;
  Instr *pIVar12;
  intptr_t iVar13;
  Lowerer *resultObjOpnd;
  Opnd *opndArg;
  HelperCallOpnd *pHVar14;
  RegOpnd *pRVar15;
  IntConstOpnd *callInfo;
  byte bVar16;
  RegOpnd *this_01;
  uint lineNumber;
  char *this_02;
  undefined7 in_register_00000081;
  JnHelperMethod JVar17;
  byte bVar18;
  Instr *local_b8;
  Instr *startCallInstr;
  LabelInstr *local_a8;
  Instr *local_a0;
  undefined1 local_98 [8];
  AutoReuseOpnd autoReuseSavedCtorOpnd;
  Instr *local_60;
  bool local_37;
  byte local_36;
  byte local_35;
  bool local_34;
  bool local_33;
  byte local_32;
  byte local_31;
  bool skipNewScObj;
  bool returnNewScObj;
  bool emitBailOut;
  
  autoReuseSavedCtorOpnd._16_4_ =
       SUB84(CONCAT71(in_register_00000081,isBaseClassConstructorNewScObject),0);
  pLVar7 = this;
  if ((newObjInstr->m_kind == InstrKindJitProfiling) &&
     (pLVar7 = (Lowerer *)newObjInstr, pJVar6 = IR::Instr::AsJitProfilingInstr(newObjInstr),
     (pJVar6->field_0x60 & 4) != 0)) {
    if (!callCtor) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x117d,"(callCtor)","callCtor");
      if (!bVar5) goto LAB_005490af;
      *puVar8 = 0;
    }
    pJVar6 = IR::Instr::AsJitProfilingInstr(newObjInstr);
    pIVar12 = LowerProfiledNewArray(this,pJVar6,false);
    return pIVar12;
  }
  OVar1 = newObjInstr->m_opcode;
  local_35 = OVar1 == NewScObjArraySpread;
  local_36 = OVar1 == NewScObjectSpread;
  func = newObjInstr->m_func;
  local_a0 = InsertLoweredRegionStartMarker(pLVar7,newObjInstr);
  this_01 = (RegOpnd *)newObjInstr->m_src1;
  pLVar7 = (Lowerer *)IR::Opnd::AsRegOpnd(newObjInstr->m_dst);
  if ((callCtor && hasArgs) && (newObjInstr->m_src2 == (Opnd *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x118e,"(!callCtor || !hasArgs || (newObjInstr->GetSrc2() != nullptr ))",
                       "!callCtor || !hasArgs || (newObjInstr->GetSrc2() != nullptr )");
    if (!bVar5) goto LAB_005490af;
    *puVar8 = 0;
  }
  autoReuseSavedCtorOpnd._20_4_ = ZEXT24(OVar1);
  local_37 = false;
  local_34 = false;
  local_33 = false;
  newObjDst = pLVar7;
  if (callCtor) {
    newObjDst = (Lowerer *)IR::RegOpnd::New(TyVar,func);
  }
  pLVar9 = IR::LabelInstr::New(Label,func,true);
  local_a8 = IR::LabelInstr::New(Label,func,false);
  startCallInstr = &pLVar9->super_Instr;
  local_31 = TryLowerNewScObjectWithFixedCtorCache
                       (this,newObjInstr,(RegOpnd *)newObjDst,pLVar9,local_a8,&local_37,&local_34,
                        &local_33);
  local_32 = local_37;
  bVar16 = local_37 ^ 1;
  if (bVar16 == 0 && !callCtor) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x119c,"(!skipNewScObj || callCtor)",
                       "What will we return if we skip the default new object and don\'t call the ctor?"
                      );
    if (!bVar5) goto LAB_005490af;
    *puVar8 = 0;
  }
  if (local_32 == 0) {
    if (local_31 != 0) goto LAB_005485a9;
  }
  else {
    if (local_34 == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x119d,"(!skipNewScObj || !returnNewScObj)",
                         "!skipNewScObj || !returnNewScObj");
      if (!bVar5) goto LAB_005490af;
      *puVar8 = 0;
    }
    if (local_31 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x119e,"(usedFixedCtorCache || !skipNewScObj)",
                         "usedFixedCtorCache || !skipNewScObj");
      if (!bVar5) goto LAB_005490af;
      *puVar8 = 0;
    }
    else {
LAB_005485a9:
      bVar5 = IR::Instr::HasFixedFunctionAddressTarget(newObjInstr);
      if (!bVar5) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x119f,
                           "(!usedFixedCtorCache || newObjInstr->HasFixedFunctionAddressTarget())",
                           "!usedFixedCtorCache || newObjInstr->HasFixedFunctionAddressTarget()");
        if (!bVar5) goto LAB_005490af;
        *puVar8 = 0;
      }
      if (local_32 == 0) goto LAB_00548665;
    }
    if (local_33 == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x11a0,"(!skipNewScObj || !emitBailOut)","!skipNewScObj || !emitBailOut");
      if (!bVar5) goto LAB_005490af;
      *puVar8 = 0;
    }
  }
LAB_00548665:
  local_b8 = (Instr *)0x0;
  if (callCtor && hasArgs) {
    bVar5 = IR::Instr::HasEmptyArgOutChain(newObjInstr,&local_b8);
    hasArgs = !bVar5;
  }
  if (local_32 == 0) {
    if (local_31 != 0) {
      IR::Instr::InsertBefore(newObjInstr,startCallInstr);
    }
    if (local_33 == true) {
      pLVar10 = (Lowerer *)IR::Instr::New(newObjInstr->m_opcode,func);
      IR::Instr::TransferTo(newObjInstr,(Instr *)pLVar10);
      newObjInstr->m_opcode = BailOut;
      IR::Instr::InsertAfter(newObjInstr,(Instr *)pLVar10);
      local_60 = (Instr *)0x0;
      GenerateBailOut(this,newObjInstr,(BranchInstr *)0x0,(LabelInstr *)0x0,(LabelInstr *)0x0);
      bVar16 = 0;
      newObjInstr = (Instr *)pLVar10;
    }
    else {
      if ((*(byte *)((long)&(pLVar7->m_lowererMD).FloatPrefThreshold + 3) & 0x10) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,0x11ca,"(!newObjDst->CanStoreTemp())","!newObjDst->CanStoreTemp()");
        if (!bVar5) goto LAB_005490af;
        *puVar8 = 0;
      }
      LoadScriptContext(this,newObjInstr);
      pLVar9 = local_a8;
      if (!callCtor) {
        JVar17 = (uint)(hasArgs ^ 1U) + (uint)(hasArgs ^ 1U) * 2 + HelperNewScObjectNoCtor;
        if (autoReuseSavedCtorOpnd.autoDelete != false) {
          JVar17 = hasArgs ^ HelperNewScObjectNoArgNoCtorFull;
        }
        if (local_a8 == (LabelInstr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x11e1,"(callCtorLabel != nullptr)","callCtorLabel != nullptr");
          if (!bVar5) goto LAB_005490af;
          *puVar8 = 0;
        }
        IR::Instr::InsertAfter(newObjInstr,&pLVar9->super_Instr);
        this_02 = (char *)&this->m_lowererMD;
        opndArg = IR::Instr::UnlinkSrc1(newObjInstr);
        LowererMD::LoadHelperArgument((LowererMD *)this_02,newObjInstr,opndArg);
        LowererMD::ChangeToHelperCall
                  ((LowererMD *)this_02,newObjInstr,JVar17,(LabelInstr *)0x0,(Opnd *)0x0,
                   (PropertySymOpnd *)0x0,false);
        if (newObjDst != pLVar7) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar8 = 1;
          this_02 = 
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
          ;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x11e9,"(createObjDst == newObjDst)","createObjDst == newObjDst");
          if (!bVar5) goto LAB_005490af;
          *puVar8 = 0;
        }
        pIVar12 = RemoveLoweredRegionStartMarker((Lowerer *)this_02,local_a0);
        return pIVar12;
      }
      bVar16 = local_31 | hasArgs;
      LowererMD::LoadHelperArgument(&this->m_lowererMD,newObjInstr,newObjInstr->m_src1);
      pHVar14 = IR::HelperCallOpnd::New(bVar16 + HelperNewScObjectNoArg,func);
      local_60 = IR::Instr::New(Call,(Opnd *)newObjDst,&pHVar14->super_Opnd,func);
      IR::Instr::InsertBefore(newObjInstr,local_60);
      LowererMD::LowerCall(&this->m_lowererMD,local_60,0);
      bVar16 = bVar16 ^ 1;
    }
    bVar18 = (local_31 | hasArgs) & callCtor;
  }
  else {
    bVar18 = (local_31 | hasArgs) & callCtor;
    if (bVar16 == 0 && bVar18 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x11f5,"(!skipNewScObj || callCtor)",
                         "What will we return if we skip the default new object and don\'t call the ctor?"
                        );
      if (!bVar5) goto LAB_005490af;
      *puVar8 = 0;
      bVar16 = 0;
      local_60 = (Instr *)0x0;
    }
    else {
      bVar16 = 0;
      local_60 = (Instr *)0x0;
    }
  }
  bVar4 = local_31;
  IR::Instr::InsertBefore(newObjInstr,&local_a8->super_Instr);
  if ((callCtor & bVar4) == 1) {
    this_00 = IR::Instr::GetFixedFunction(newObjInstr);
    iVar11 = FixedFieldInfo::GetFuncInfoAddr(this_00);
    if ((hasArgs != false) ||
       ((iVar13 = ThreadContextInfo::GetJavascriptObjectNewInstanceAddr
                            (this->m_func->m_threadContextInfo), iVar11 != iVar13 &&
        (iVar13 = ThreadContextInfo::GetJavascriptArrayNewInstanceAddr
                            (this->m_func->m_threadContextInfo), iVar11 != iVar13))))
    goto LAB_00548946;
    iVar13 = ThreadContextInfo::GetJavascriptObjectNewInstanceAddr
                       (this->m_func->m_threadContextInfo);
    if (iVar11 == iVar13) {
      JVar17 = HelperNewJavascriptObjectNoArg;
      if (local_32 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        lineNumber = 0x1205;
LAB_00548ca3:
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                           ,lineNumber,"(skipNewScObj)","skipNewScObj");
        if (!bVar5) goto LAB_005490af;
        *puVar8 = 0;
      }
LAB_00548d56:
      LoadScriptContext(this,newObjInstr);
      pHVar14 = IR::HelperCallOpnd::New(JVar17,func);
      pIVar12 = IR::Instr::New(Call,(Opnd *)pLVar7,&pHVar14->super_Opnd,func);
      IR::Instr::InsertBefore(newObjInstr,pIVar12);
      LowererMD::LowerCall(&this->m_lowererMD,pIVar12,0);
      goto LAB_00548db0;
    }
    iVar13 = ThreadContextInfo::GetJavascriptArrayNewInstanceAddr(this->m_func->m_threadContextInfo)
    ;
    if (iVar11 == iVar13) {
      JVar17 = HelperNewJavascriptArrayNoArg;
      if (local_32 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar8 = 1;
        lineNumber = 0x120b;
        goto LAB_00548ca3;
      }
      goto LAB_00548d56;
    }
    JVar17 = JnHelperMethodCount;
    if (bVar18 == 0) goto LAB_00548d56;
  }
  else {
LAB_00548946:
    if (bVar18 == 0) {
LAB_00548db0:
      autoReuseSavedCtorOpnd.func._1_1_ = 1;
      local_98 = (undefined1  [8])0x0;
      if (*(char *)((long)(((Lowerer *)newObjInstr)->m_lowererMD).lowererMDArch.helperCallArgs + 1)
          == '\n') {
        bVar5 = Func::IsSimpleJit(this->m_func);
        if (!bVar5) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x125b,"(m_func->IsSimpleJit())","m_func->IsSimpleJit()");
          if (!bVar5) goto LAB_005490af;
          *puVar8 = 0;
        }
        if (DAT_01441e6c == '\x01') {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x125c,"(!(Js::Configuration::Global.flags.NewSimpleJit))",
                             "!CONFIG_FLAG(NewSimpleJit)");
          if (!bVar5) goto LAB_005490af;
          *puVar8 = 0;
        }
        if ((bVar16 == 1 && pLVar7 != (Lowerer *)0x0) &&
           (bVar5 = IR::Opnd::IsRegOpnd((Opnd *)this_01), bVar5)) {
          pRVar15 = IR::Opnd::AsRegOpnd((Opnd *)pLVar7);
          pSVar2 = pRVar15->m_sym;
          pRVar15 = IR::Opnd::AsRegOpnd((Opnd *)this_01);
          if (pSVar2 == pRVar15->m_sym) {
            bVar5 = Func::IsSimpleJit((((Lowerer *)newObjInstr)->m_lowererMD).lowererMDArch.m_func);
            if (!bVar5) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar8 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                 ,0x1266,"(newObjInstr->m_func->IsSimpleJit())",
                                 "newObjInstr->m_func->IsSimpleJit()");
              if (!bVar5) goto LAB_005490af;
              *puVar8 = 0;
            }
            if (newObjDst == pLVar7) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
              *puVar8 = 1;
              bVar5 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                                 ,0x1267,"(createObjDst != newObjDst)","createObjDst != newObjDst");
              if (!bVar5) goto LAB_005490af;
              *puVar8 = 0;
            }
            pRVar15 = IR::RegOpnd::New((this_01->super_Opnd).m_type,
                                       (((Lowerer *)newObjInstr)->m_lowererMD).lowererMDArch.m_func)
            ;
            IR::AutoReuseOpnd::Initialize
                      ((AutoReuseOpnd *)local_98,&pRVar15->super_Opnd,
                       (((Lowerer *)newObjInstr)->m_lowererMD).lowererMDArch.m_func,true);
            InsertMove(&pRVar15->super_Opnd,(Opnd *)this_01,newObjInstr,true);
            this_01 = pRVar15;
          }
        }
        callInfo = MakeCallInfoConst(1,1,func);
        if (local_60 == (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar8 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                             ,0x1273,"(newScObjCall)","newScObjCall");
          if (!bVar5) goto LAB_005490af;
          *puVar8 = 0;
        }
        pJVar6 = IR::Instr::AsJitProfilingInstr(newObjInstr);
        GenerateCallProfiling
                  (this,pJVar6->profileId,(pJVar6->field_2).inlineCacheIndex,(Opnd *)newObjDst,
                   &this_01->super_Opnd,&callInfo->super_Opnd,false,local_60,newObjInstr);
      }
      if (newObjDst != pLVar7 && local_32 == 0) {
        InsertMove((Opnd *)pLVar7,(Opnd *)newObjDst,newObjInstr,true);
      }
      IR::Instr::Remove(newObjInstr);
      goto LAB_00548f8a;
    }
  }
  autoReuseSavedCtorOpnd.func._1_1_ = 1;
  local_98 = (undefined1  [8])0x0;
  pLVar10 = (Lowerer *)&this->m_lowererMD;
  pIVar12 = LowererMD::LoadNewScObjFirstArg
                      ((LowererMD *)pLVar10,newObjInstr,(Opnd *)newObjDst,
                       (ushort)(local_36 | local_35));
  insertBeforeInstr = (((Lowerer *)newObjInstr)->m_lowererMD).m_func;
  if (local_32 == 0) {
    resultObjOpnd = (Lowerer *)IR::RegOpnd::New(TyVar,func);
    IR::Instr::UnlinkDst(newObjInstr);
    IR::Instr::SetDst(newObjInstr,(Opnd *)resultObjOpnd);
    if ((autoReuseSavedCtorOpnd._20_4_ == 0x160) || (autoReuseSavedCtorOpnd._20_4_ == 0xc9)) {
      LowerSpreadCall(this,newObjInstr,CallFlags_New,false);
    }
    else {
      LowererMD::LowerCallI((LowererMD *)pLVar10,newObjInstr,1,false,pIVar12);
    }
    if (local_34 == false) {
      LowerGetNewScObjectCommon
                (this,(RegOpnd *)resultObjOpnd,(RegOpnd *)resultObjOpnd,(RegOpnd *)newObjDst,
                 (Instr *)insertBeforeInstr);
      newObjDst = resultObjOpnd;
    }
    pLVar10 = pLVar7;
    InsertMove((Opnd *)pLVar7,(Opnd *)newObjDst,(Instr *)insertBeforeInstr,true);
  }
  else {
    if ((Lowerer *)(((Lowerer *)newObjInstr)->m_lowererMD).lowererMDArch.helperCallArgs[1] != pLVar7
       ) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x1228,"(newObjInstr->GetDst() == newObjDst)",
                         "newObjInstr->GetDst() == newObjDst");
      if (!bVar5) {
LAB_005490af:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar8 = 0;
    }
    if ((autoReuseSavedCtorOpnd._20_4_ == 0x160) || (autoReuseSavedCtorOpnd._20_4_ == 0xc9)) {
      pLVar10 = this;
      LowerSpreadCall(this,newObjInstr,CallFlags_New,false);
    }
    else {
      LowererMD::LowerCallI((LowererMD *)pLVar10,newObjInstr,1,false,pIVar12);
    }
  }
  newObjInstr = (Instr *)pLVar10;
  if (local_31 == 0) {
    LowerUpdateNewScObjectCache
              (this,(Instr *)insertBeforeInstr,(Opnd *)pLVar7,(Opnd *)this_01,false);
    newObjInstr = (Instr *)this;
  }
LAB_00548f8a:
  pIVar12 = RemoveLoweredRegionStartMarker((Lowerer *)newObjInstr,local_a0);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_98);
  return pIVar12;
}

Assistant:

IR::Instr *
Lowerer::LowerNewScObject(IR::Instr *newObjInstr, bool callCtor, bool hasArgs, bool isBaseClassConstructorNewScObject)
{
    if (newObjInstr->IsJitProfilingInstr() && newObjInstr->AsJitProfilingInstr()->isNewArray)
    {
        Assert(callCtor);
        return LowerProfiledNewArray(newObjInstr->AsJitProfilingInstr(), hasArgs);
    }

    bool isSpreadCall = newObjInstr->m_opcode == Js::OpCode::NewScObjectSpread ||
        newObjInstr->m_opcode == Js::OpCode::NewScObjArraySpread;

    Func* func = newObjInstr->m_func;

    // Insert a temporary label before the instruction we're about to lower, so that we can return
    // the first instruction above that needs to be lowered after we're done - regardless of argument
    // list, StartCall, etc.
    IR::Instr* startMarkerInstr = InsertLoweredRegionStartMarker(newObjInstr);

    IR::Opnd *ctorOpnd = newObjInstr->GetSrc1();
    IR::RegOpnd *newObjDst = newObjInstr->GetDst()->AsRegOpnd();

    Assert(!callCtor || !hasArgs || (newObjInstr->GetSrc2() != nullptr /*&& newObjInstr->GetSrc2()->IsSymOpnd()*/));

    bool skipNewScObj = false;
    bool returnNewScObj = false;
    bool emitBailOut = false;
    // If we haven't yet split NewScObject into NewScObjectNoCtor and CallI, we will need a temporary register
    // to hold the result of the object allocation.
    IR::RegOpnd* createObjDst = callCtor ? IR::RegOpnd::New(TyVar, func) : newObjDst;
    IR::LabelInstr* helperOrBailoutLabel = IR::LabelInstr::New(Js::OpCode::Label, func, /* isOpHelper = */ true);
    IR::LabelInstr* callCtorLabel = IR::LabelInstr::New(Js::OpCode::Label, func, /* isOpHelper = */ false);

    // Try to emit the fast allocation and construction path.
    bool usedFixedCtorCache = TryLowerNewScObjectWithFixedCtorCache(newObjInstr, createObjDst, helperOrBailoutLabel, callCtorLabel, skipNewScObj, returnNewScObj, emitBailOut);

    AssertMsg(!skipNewScObj || callCtor, "What will we return if we skip the default new object and don't call the ctor?");
    Assert(!skipNewScObj || !returnNewScObj);
    Assert(usedFixedCtorCache || !skipNewScObj);
    Assert(!usedFixedCtorCache || newObjInstr->HasFixedFunctionAddressTarget());
    Assert(!skipNewScObj || !emitBailOut);

#if DBG && 0 // TODO: OOP JIT, enable assert
    if (usedFixedCtorCache)
    {
        Js::JavascriptFunction* ctor = newObjInstr->GetFixedFunction();
        Js::FunctionInfo* ctorInfo = ctor->GetFunctionInfo();
        Assert((ctorInfo->GetAttributes() & Js::FunctionInfo::Attributes::ErrorOnNew) == 0);
        Assert(!!(ctorInfo->GetAttributes() & Js::FunctionInfo::Attributes::SkipDefaultNewObject) == skipNewScObj);
    }
#endif

    IR::Instr* startCallInstr = nullptr;
    if (callCtor && hasArgs)
    {
        hasArgs = !newObjInstr->HasEmptyArgOutChain(&startCallInstr);
    }

    // If we're not skipping the default new object, let's emit bailout or a call to NewScObject* helper
    IR::JnHelperMethod newScHelper = IR::HelperInvalid;
    IR::Instr *newScObjCall = nullptr;
    if (!skipNewScObj)
    {
        // If we emitted the fast path, this block is a helper block.
        if (usedFixedCtorCache)
        {
            newObjInstr->InsertBefore(helperOrBailoutLabel);
        }

        if (emitBailOut)
        {
            IR::Instr* bailOutInstr = newObjInstr;

            newObjInstr = IR::Instr::New(newObjInstr->m_opcode, func);
            bailOutInstr->TransferTo(newObjInstr);
            bailOutInstr->m_opcode = Js::OpCode::BailOut;
            bailOutInstr->InsertAfter(newObjInstr);

            GenerateBailOut(bailOutInstr);
        }
        else
        {
            Assert(!newObjDst->CanStoreTemp());
            // createObjDst = NewScObject...(ctorOpnd)

            LoadScriptContext(newObjInstr);

            if (callCtor)
            {
                newScHelper = (hasArgs || usedFixedCtorCache ? IR::HelperNewScObjectNoCtor : IR::HelperNewScObjectNoArg);

                m_lowererMD.LoadHelperArgument(newObjInstr, newObjInstr->GetSrc1());

                newScObjCall = IR::Instr::New(Js::OpCode::Call, createObjDst, IR::HelperCallOpnd::New(newScHelper, func), func);
                newObjInstr->InsertBefore(newScObjCall);
                m_lowererMD.LowerCall(newScObjCall, 0);
            }
            else
            {
                newScHelper = 
                    (isBaseClassConstructorNewScObject ?
                        (hasArgs ? IR::HelperNewScObjectNoCtorFull : IR::HelperNewScObjectNoArgNoCtorFull) :
                        (hasArgs ? IR::HelperNewScObjectNoCtor : IR::HelperNewScObjectNoArgNoCtor));

                // Branch around the helper call to execute the inlined ctor.
                Assert(callCtorLabel != nullptr);
                newObjInstr->InsertAfter(callCtorLabel);

                // Change the NewScObject* to a helper call on the spot. This generates implicit call bailout for us if we need one.
                m_lowererMD.LoadHelperArgument(newObjInstr, newObjInstr->UnlinkSrc1());
                m_lowererMD.ChangeToHelperCall(newObjInstr, newScHelper);

                // Then we're done.
                Assert(createObjDst == newObjDst);

                // Return the first instruction above the region we've just lowered.
                return RemoveLoweredRegionStartMarker(startMarkerInstr);                    
            }
        }
    }

    // If we call HelperNewScObjectNoArg directly, we won't be calling the constructor from here, because the helper will do it.
    // We could probably avoid this complexity by converting NewScObjectNoArg to NewScObject in the IRBuilder, once we have dedicated
    // code paths for new Object() and new Array().
    callCtor &= hasArgs || usedFixedCtorCache;
    AssertMsg(!skipNewScObj || callCtor, "What will we return if we skip the default new object and don't call the ctor?");

    newObjInstr->InsertBefore(callCtorLabel);

    if (callCtor && usedFixedCtorCache)
    {
        IR::JnHelperMethod ctorHelper = IR::JnHelperMethodCount;

        // If we have no arguments (i.e. the argument chain is empty), we can recognize a couple of common special cases, such
        // as new Object() or new Array(), for which we have optimized helpers.
        FixedFieldInfo* ctor = newObjInstr->GetFixedFunction();
        intptr_t ctorInfo = ctor->GetFuncInfoAddr();
        if (!hasArgs && (ctorInfo == m_func->GetThreadContextInfo()->GetJavascriptObjectNewInstanceAddr() || ctorInfo == m_func->GetThreadContextInfo()->GetJavascriptArrayNewInstanceAddr()))
        {
            if (ctorInfo == m_func->GetThreadContextInfo()->GetJavascriptObjectNewInstanceAddr())
            {
                Assert(skipNewScObj);
                ctorHelper = IR::HelperNewJavascriptObjectNoArg;
                callCtor = false;
            }
            else if (ctorInfo == m_func->GetThreadContextInfo()->GetJavascriptArrayNewInstanceAddr())
            {
                Assert(skipNewScObj);
                ctorHelper = IR::HelperNewJavascriptArrayNoArg;
                callCtor = false;
            }

            if (!callCtor)
            {
                LoadScriptContext(newObjInstr);

                IR::Instr *ctorCall = IR::Instr::New(Js::OpCode::Call, newObjDst,  IR::HelperCallOpnd::New(ctorHelper, func), func);
                newObjInstr->InsertBefore(ctorCall);
                m_lowererMD.LowerCall(ctorCall, 0);
            }
        }
    }

    IR::AutoReuseOpnd autoReuseSavedCtorOpnd;
    if (callCtor)
    {
        // Load the first argument, which is either the object just created or null. Spread has an extra argument.
        IR::Instr * argInstr = this->m_lowererMD.LoadNewScObjFirstArg(newObjInstr, createObjDst, isSpreadCall ? 1 : 0);

        IR::Instr * insertAfterCtorInstr = newObjInstr->m_next;

        if (skipNewScObj)
        {
            // Since we skipped the default new object, we must be returning whatever the constructor returns
            // (which better be an Object), so let's just use newObjDst directly.
            // newObjDst = newObjInstr->m_src1(createObjDst, ...)
            Assert(newObjInstr->GetDst() == newObjDst);
            if (isSpreadCall)
            {
                newObjInstr = this->LowerSpreadCall(newObjInstr, Js::CallFlags_New);
            }
            else
            {
                newObjInstr = this->m_lowererMD.LowerCallI(newObjInstr, Js::CallFlags_New, false, argInstr);
            }
        }
        else
        {
            // We may need to return the default new object or whatever the constructor returns. Let's stash
            // away the constructor's return in a temporary operand, and do the right check, if necessary.
            // ctorResultObjOpnd = newObjInstr->m_src1(createObjDst, ...)
            IR::RegOpnd *ctorResultObjOpnd = IR::RegOpnd::New(TyVar, func);
            newObjInstr->UnlinkDst();
            newObjInstr->SetDst(ctorResultObjOpnd);

            if (isSpreadCall)
            {
                newObjInstr = this->LowerSpreadCall(newObjInstr, Js::CallFlags_New);
            }
            else
            {
                newObjInstr = this->m_lowererMD.LowerCallI(newObjInstr, Js::CallFlags_New, false, argInstr);
            }

            if (returnNewScObj)
            {
                // MOV newObjDst, createObjDst
                this->InsertMove(newObjDst, createObjDst, insertAfterCtorInstr);
            }
            else
            {
                LowerGetNewScObjectCommon(ctorResultObjOpnd, ctorResultObjOpnd, createObjDst, insertAfterCtorInstr);
                this->InsertMove(newObjDst, ctorResultObjOpnd, insertAfterCtorInstr);
            }
        }

        // We don't ever need to update the constructor cache, if we hard coded it.  Caches requiring update after constructor
        // don't get cloned, and those that don't require update will never need one anymore.
        if (!usedFixedCtorCache)
        {
            LowerUpdateNewScObjectCache(insertAfterCtorInstr, newObjDst, ctorOpnd, false /* isCtorFunction */);
        }
    }
    else
    {
        if (newObjInstr->IsJitProfilingInstr())
        {
            Assert(m_func->IsSimpleJit());
            Assert(!CONFIG_FLAG(NewSimpleJit));

            // This path skipped calling the Ctor, which skips calling LowerCallI with newObjInstr, meaning that the call will not be profiled.
            //   So we insert it manually here.

            if(newScHelper == IR::HelperNewScObjectNoArg &&
                newObjDst &&
                ctorOpnd->IsRegOpnd() &&
                newObjDst->AsRegOpnd()->m_sym == ctorOpnd->AsRegOpnd()->m_sym)
            {
                Assert(newObjInstr->m_func->IsSimpleJit());
                Assert(createObjDst != newObjDst);

                // The function object sym is going to be overwritten, so save it in a temp for profiling
                IR::RegOpnd *const savedCtorOpnd = IR::RegOpnd::New(ctorOpnd->GetType(), newObjInstr->m_func);
                autoReuseSavedCtorOpnd.Initialize(savedCtorOpnd, newObjInstr->m_func);
                Lowerer::InsertMove(savedCtorOpnd, ctorOpnd, newObjInstr);
                ctorOpnd = savedCtorOpnd;
            }

            // It is a constructor (CallFlags_New) and therefore a single argument (this) would have been given.
            const auto info = Lowerer::MakeCallInfoConst(Js::CallFlags_New, 1, func);

            Assert(newScObjCall);
            IR::JitProfilingInstr *const newObjJitProfilingInstr = newObjInstr->AsJitProfilingInstr();
            GenerateCallProfiling(
                newObjJitProfilingInstr->profileId,
                newObjJitProfilingInstr->inlineCacheIndex,
                createObjDst,
                ctorOpnd,
                info,
                false,
                newScObjCall,
                newObjInstr);
        }

        // MOV newObjDst, createObjDst
        if (!skipNewScObj && createObjDst != newObjDst)
        {
            this->InsertMove(newObjDst, createObjDst, newObjInstr);
        }
        newObjInstr->Remove();
    }

    // Return the first instruction above the region we've just lowered.
    return RemoveLoweredRegionStartMarker(startMarkerInstr);
}